

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O1

mode_set * __thiscall
ev3dev::dc_motor::commands_abi_cxx11_(mode_set *__return_storage_ptr__,dc_motor *this)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"commands","");
  device::get_attr_set(__return_storage_ptr__,&this->super_device,&local_40,(string *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

mode_set commands() const { return get_attr_set("commands"); }